

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O1

void __thiscall diy::MemoryBuffer::save_binary_blob(MemoryBuffer *this,char *x,size_t count)

{
  undefined8 local_28;
  undefined8 uStack_20;
  code *local_18;
  code *local_10;
  
  local_28 = 0;
  uStack_20 = 0;
  local_10 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/serialization.hpp:563:32)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/serialization.hpp:563:32)>
             ::_M_manager;
  (*(this->super_BinaryBuffer)._vptr_BinaryBuffer[9])();
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,3);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }